

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::toString(string *__return_storage_ptr__,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *psVar1;
  char cVar2;
  IMutableContext *pIVar3;
  pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  undefined1 local_70 [8];
  string s;
  string subs;
  
  std::__cxx11::string::string((string *)local_70,(string *)value);
  pIVar3 = getCurrentMutableContext();
  (*(pIVar3->super_IContext)._vptr_IContext[6])((undefined1 *)((long)&s.field_2 + 8),pIVar3);
  local_78 = __return_storage_ptr__;
  cVar2 = (**(code **)(*(long *)s.field_2._8_8_ + 0x58))();
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)((long)&s.field_2 + 8));
  if (cVar2 != '\0') {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (s.field_2._M_local_buf + 8);
    for (pcVar4 = (pointer)0x0; pcVar4 < s._M_dataplus._M_p; pcVar4 = pcVar4 + 1) {
      s.field_2._8_8_ = &subs._M_string_length;
      subs._M_dataplus._M_p = (pointer)0x0;
      subs._M_string_length._0_1_ = 0;
      if (((*(char *)((long)local_70 + (long)pcVar4) == '\t') ||
          (*(char *)((long)local_70 + (long)pcVar4) == '\n')) &&
         (std::__cxx11::string::assign((char *)__rhs), subs._M_dataplus._M_p != (pointer)0x0)) {
        std::__cxx11::string::substr((ulong)&local_98,(ulong)local_70);
        std::operator+(&local_b8,&local_98,__rhs);
        pcVar4 = pcVar4 + 1;
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)local_70);
        std::operator+(&local_f8,&local_b8,&local_d8);
        std::__cxx11::string::operator=((string *)local_70,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_98);
      }
      std::__cxx11::string::~string((string *)__rhs);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&s.field_2 + 8),"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  psVar1 = local_78;
  std::operator+(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&s.field_2 + 8),"\"");
  std::__cxx11::string::~string((string *)(s.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_70);
  return psVar1;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    if( getCurrentContext().getConfig()->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}